

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::ModuleHeaderSyntax_const&>
          (BumpAllocator *this,ModuleHeaderSyntax *args)

{
  ModuleHeaderSyntax *this_00;
  
  this_00 = (ModuleHeaderSyntax *)allocate(this,0xa0,8);
  slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }